

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts2-lace.c
# Opt level: O3

void lace_parseParams(int *argc_p,char **argv)

{
  int iVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  
  iVar1 = *argc_p;
  iVar8 = 1;
  if (iVar1 != 1) {
    iVar7 = 1;
    do {
      pbVar2 = (byte *)argv[iVar7];
      uVar3 = *pbVar2 - 0x2d;
      if (*pbVar2 == 0x2d) {
        uVar3 = pbVar2[1] - 0x77;
        if (uVar3 == 0) {
          uVar3 = (uint)pbVar2[2];
        }
        if (uVar3 != 0) {
          uVar3 = pbVar2[1] - 0x71;
          if (uVar3 == 0) {
            uVar3 = (uint)pbVar2[2];
          }
          goto LAB_0010482b;
        }
        piVar6 = &_lace_workers;
      }
      else {
LAB_0010482b:
        iVar8 = iVar7;
        if (uVar3 != 0) break;
        piVar6 = &_lace_dqsize;
      }
      iVar8 = iVar1;
      if (iVar7 + 1 == iVar1) break;
      iVar4 = atoi(argv[iVar7 + 1]);
      *piVar6 = iVar4;
      iVar7 = iVar7 + 2;
    } while (iVar7 != iVar1);
  }
  iVar7 = iVar1 - iVar8;
  if (iVar7 != 0 && iVar8 <= iVar1) {
    lVar5 = 0;
    do {
      argv[lVar5 + 1] = argv[iVar8 + lVar5];
      lVar5 = lVar5 + 1;
    } while ((ulong)(iVar7 + 1) - 1 != lVar5);
  }
  *argc_p = iVar7 + 1;
  return;
}

Assistant:

void lace_parseParams(int* argc_p, char *argv[])
{
  int argc = *argc_p;

  int i=1;

  while (1) {
    if (i == argc) break;
    if (strcmp("-w", argv[i])==0) {
      i++;
      if (i == argc) break;
      _lace_workers = atoi(argv[i]);
    }
    else if (strcmp("-q", argv[i])==0) {
      i++;
      if (i == argc) break;
      _lace_dqsize = atoi(argv[i]);
    }
    else break;
    i++;
  }

  int j;
  for (j=1;j <= argc - i;j++) argv[j] = argv[i - 1 + j];
  *argc_p = argc - i + 1;
}